

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleComboBox::child(QAccessibleComboBox *this,int index)

{
  bool bVar1;
  QComboBox *this_00;
  QObject *pQVar2;
  QAccessibleInterface *pQVar3;
  int in_ESI;
  QAbstractItemView *view;
  QComboBox *cBox;
  
  this_00 = comboBox((QAccessibleComboBox *)0x7d4e3b);
  if (this_00 != (QComboBox *)0x0) {
    if (in_ESI == 0) {
      pQVar2 = (QObject *)QComboBox::view(this_00);
      pQVar3 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar2);
      return pQVar3;
    }
    if ((in_ESI == 1) && (bVar1 = QComboBox::isEditable(this_00), bVar1)) {
      pQVar2 = (QObject *)QComboBox::lineEdit(this_00);
      pQVar3 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar2);
      return pQVar3;
    }
  }
  return (QAccessibleInterface *)0x0;
}

Assistant:

QAccessibleInterface *QAccessibleComboBox::child(int index) const
{
    if (QComboBox *cBox = comboBox()) {
        if (index == 0) {
            QAbstractItemView *view = cBox->view();
            //QWidget *parent = view ? view->parentWidget() : 0;
            return QAccessible::queryAccessibleInterface(view);
        } else if (index == 1 && cBox->isEditable()) {
            return QAccessible::queryAccessibleInterface(cBox->lineEdit());
        }
    }
    return nullptr;
}